

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

void output_nybble(char *outfile,int bits)

{
  long lVar1;
  int iVar2;
  
  lVar1 = noutchar;
  buffer2 = bits & 0xfU | buffer2 << 4;
  iVar2 = bits_to_go2 + -4;
  if (bits_to_go2 < 5) {
    outfile[noutchar] = (char)(buffer2 >> (4U - (char)bits_to_go2 & 0x1f));
    if (lVar1 < noutmax) {
      noutchar = lVar1 + 1;
    }
    iVar2 = bits_to_go2 + 4;
  }
  bits_to_go2 = iVar2;
  bitcount = bitcount + 4;
  return;
}

Assistant:

static void
output_nybble(char *outfile, int bits)
{
	/*
	 * insert 4 bits at end of buffer
	 */
	buffer2 = (buffer2<<4) | ( bits & 15 );
	bits_to_go2 -= 4;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += 4;
}